

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funcexecutors.cpp
# Opt level: O3

TestFuncExecutorBase * trun::TestFuncExecutorFactory::Create(Ref *library)

{
  TestExecutiontype TVar1;
  element_type *peVar2;
  Config *pCVar3;
  TestFuncExecutorParallel *pTVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_50;
  element_type *local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40;
  element_type *local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  element_type *local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  element_type *local_18;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_10;
  
  if (Create(std::shared_ptr<trun::IDynLibrary>)::sequentialExecutor == '\0') {
    Create();
  }
  if (Create(std::shared_ptr<trun::IDynLibrary>)::parallelExecutor == '\0') {
    Create();
  }
  if (Create(std::shared_ptr<trun::IDynLibrary>)::parallelExecutorPThread == '\0') {
    Create();
  }
  pCVar3 = Config::Instance();
  TVar1 = pCVar3->testExecutionType;
  if (TVar1 == kThreadedWithExit) {
    Create::parallelExecutorPThread.super_TestFuncExecutorSequential.super_TestFuncExecutorBase.
    library.super___shared_ptr<trun::IDynLibrary,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (library->super___shared_ptr<trun::IDynLibrary,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_40._M_pi =
         (library->super___shared_ptr<trun::IDynLibrary,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
         _M_pi;
    if (local_40._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_40._M_pi)->_M_use_count = (local_40._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_40._M_pi)->_M_use_count = (local_40._M_pi)->_M_use_count + 1;
      }
    }
    local_48 = Create::parallelExecutorPThread.super_TestFuncExecutorSequential.
               super_TestFuncExecutorBase.library.
               super___shared_ptr<trun::IDynLibrary,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&Create::parallelExecutorPThread.super_TestFuncExecutorSequential.
                super_TestFuncExecutorBase.library.
                super___shared_ptr<trun::IDynLibrary,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               &local_40);
    pTVar4 = (TestFuncExecutorParallel *)&Create::parallelExecutorPThread;
    this._M_pi = local_40._M_pi;
  }
  else if (TVar1 == kThreaded) {
    Create::parallelExecutor.super_TestFuncExecutorSequential.super_TestFuncExecutorBase.library.
    super___shared_ptr<trun::IDynLibrary,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (library->super___shared_ptr<trun::IDynLibrary,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_30._M_pi =
         (library->super___shared_ptr<trun::IDynLibrary,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
         _M_pi;
    if (local_30._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_30._M_pi)->_M_use_count = (local_30._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_30._M_pi)->_M_use_count = (local_30._M_pi)->_M_use_count + 1;
      }
    }
    pTVar4 = &Create::parallelExecutor;
    local_38 = Create::parallelExecutor.super_TestFuncExecutorSequential.super_TestFuncExecutorBase.
               library.super___shared_ptr<trun::IDynLibrary,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&Create::parallelExecutor.super_TestFuncExecutorSequential.super_TestFuncExecutorBase
                .library.super___shared_ptr<trun::IDynLibrary,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,&local_30);
    this._M_pi = local_30._M_pi;
  }
  else if (TVar1 == kSequential) {
    pCVar3 = Config::Instance();
    peVar2 = (library->super___shared_ptr<trun::IDynLibrary,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    if (pCVar3->isSubProcess == true) {
      local_10._M_pi =
           (library->super___shared_ptr<trun::IDynLibrary,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
           _M_pi;
      if (local_10._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_10._M_pi)->_M_use_count = (local_10._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_10._M_pi)->_M_use_count = (local_10._M_pi)->_M_use_count + 1;
        }
      }
      pTVar4 = &Create::parallelExecutor;
      Create::parallelExecutor.super_TestFuncExecutorSequential.super_TestFuncExecutorBase.library.
      super___shared_ptr<trun::IDynLibrary,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2;
      local_18 = peVar2;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&Create::parallelExecutor.super_TestFuncExecutorSequential.
                  super_TestFuncExecutorBase.library.
                  super___shared_ptr<trun::IDynLibrary,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                 &local_10);
      this._M_pi = local_10._M_pi;
    }
    else {
      local_20._M_pi =
           (library->super___shared_ptr<trun::IDynLibrary,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
           _M_pi;
      if (local_20._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_20._M_pi)->_M_use_count = (local_20._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_20._M_pi)->_M_use_count = (local_20._M_pi)->_M_use_count + 1;
        }
      }
      Create::sequentialExecutor.super_TestFuncExecutorBase.library.
      super___shared_ptr<trun::IDynLibrary,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2;
      local_28 = peVar2;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&Create::sequentialExecutor.super_TestFuncExecutorBase.library.
                  super___shared_ptr<trun::IDynLibrary,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                 &local_20);
      pTVar4 = (TestFuncExecutorParallel *)&Create::sequentialExecutor;
      this._M_pi = local_20._M_pi;
    }
  }
  else {
    puts("Unknown or unsupported test execution model, using default");
    Create::sequentialExecutor.super_TestFuncExecutorBase.library.
    super___shared_ptr<trun::IDynLibrary,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (library->super___shared_ptr<trun::IDynLibrary,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_50._M_pi =
         (library->super___shared_ptr<trun::IDynLibrary,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
         _M_pi;
    if (local_50._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_50._M_pi)->_M_use_count = (local_50._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_50._M_pi)->_M_use_count = (local_50._M_pi)->_M_use_count + 1;
      }
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&Create::sequentialExecutor.super_TestFuncExecutorBase.library.
                super___shared_ptr<trun::IDynLibrary,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               &local_50);
    pTVar4 = (TestFuncExecutorParallel *)&Create::sequentialExecutor;
    this._M_pi = local_50._M_pi;
  }
  if (this._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this._M_pi);
  }
  return (TestFuncExecutorBase *)(TestFuncExecutorParallelPThread *)pTVar4;
}

Assistant:

TestFuncExecutorBase &TestFuncExecutorFactory::Create(IDynLibrary::Ref library) {
    static TestFuncExecutorSequential sequentialExecutor;
#ifdef TRUN_HAVE_THREADS
    static TestFuncExecutorParallel parallelExecutor;
    static TestFuncExecutorParallelPThread parallelExecutorPThread;
#endif

    switch(Config::Instance().testExecutionType) {
        case TestExecutiontype::kSequential :
            // In case we are a sub-process, we run in threads anyway  <- should we?
#ifdef TRUN_HAVE_THREADS
            if (Config::Instance().isSubProcess) {
                parallelExecutor.SetLibrary(library);
                return parallelExecutor;
            }
#endif
            sequentialExecutor.SetLibrary(library);
            return sequentialExecutor;
#ifdef TRUN_HAVE_THREADS
        case TestExecutiontype::kThreaded :
            parallelExecutor.SetLibrary(library);
            return parallelExecutor;
        case TestExecutiontype::kThreadedWithExit :
            parallelExecutorPThread.SetLibrary(library);
            return parallelExecutorPThread;
#endif
        default:
            printf("Unknown or unsupported test execution model, using default\n");
            break;
    }
    // Always available
    sequentialExecutor.SetLibrary(library);
    return sequentialExecutor;
}